

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::io::Printer::ValidateIndexLookupInBounds(unsigned_long,unsigned_long,unsigned_long,google::protobuf::io::Printer::PrintOptions)::__1,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  size_type in_R9;
  UntypedFormatSpecImpl format;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args;
  ulong local_68;
  code *local_60;
  long local_58;
  code *local_50;
  ulong local_48;
  code *local_40;
  ulong local_38;
  code *local_30;
  long local_28;
  code *local_20;
  ulong local_18;
  code *local_10;
  
  local_58 = *(long *)(this + 0x10) + 1;
  local_28 = *(long *)(this + 8) + 1;
  local_68 = (ulong)*(byte *)(*(long *)this + 0x28);
  local_60 = str_format_internal::FormatArgImpl::Dispatch<char>;
  local_50 = str_format_internal::FormatArgImpl::Dispatch<unsigned_long>;
  local_40 = str_format_internal::FormatArgImpl::Dispatch<char>;
  local_30 = str_format_internal::FormatArgImpl::Dispatch<char>;
  local_20 = str_format_internal::FormatArgImpl::Dispatch<unsigned_long>;
  local_10 = str_format_internal::FormatArgImpl::Dispatch<char>;
  format.size_ = (size_t)&local_68;
  format.data_ = (void *)0x52;
  args.len_ = in_R9;
  args.ptr_ = (pointer)&DAT_00000006;
  local_48 = local_68;
  local_38 = local_68;
  local_18 = local_68;
  str_format_internal::FormatPack_abi_cxx11_
            (__return_storage_ptr__,
             (str_format_internal *)
             "annotation arg must be in correct order as given; expected %c{%d%c but got %c{%d%c",
             format,args);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}